

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

int xmlNsInScope(xmlDocPtr doc,xmlNodePtr node,xmlNodePtr ancestor,xmlChar *prefix)

{
  xmlElementType xVar1;
  xmlChar *str1;
  int iVar2;
  xmlNs *pxVar3;
  bool bVar4;
  
  bVar4 = doc != (xmlDocPtr)node;
  if (bVar4 && doc != (xmlDocPtr)0x0) {
    do {
      xVar1 = doc->type;
      if (xVar1 == XML_ELEMENT_NODE) {
        for (pxVar3 = doc->oldNs; pxVar3 != (xmlNs *)0x0; pxVar3 = pxVar3->next) {
          str1 = pxVar3->prefix;
          if (ancestor == (xmlNodePtr)0x0 && str1 == (xmlChar *)0x0) {
            return 0;
          }
          if (((ancestor != (xmlNodePtr)0x0) && (str1 != (xmlChar *)0x0)) &&
             (iVar2 = xmlStrEqual(str1,(xmlChar *)ancestor), iVar2 != 0)) {
            return 0;
          }
        }
      }
      else if ((xVar1 == XML_ENTITY_REF_NODE) || (xVar1 == XML_ENTITY_DECL)) {
        return -1;
      }
      doc = (xmlDocPtr)doc->parent;
      bVar4 = doc != (xmlDocPtr)node;
    } while ((doc != (xmlDocPtr)0x0) && (doc != (xmlDocPtr)node));
  }
  return -(uint)bVar4 | 1;
}

Assistant:

static int
xmlNsInScope(xmlDocPtr doc ATTRIBUTE_UNUSED, xmlNodePtr node,
             xmlNodePtr ancestor, const xmlChar * prefix)
{
    xmlNsPtr tst;

    while ((node != NULL) && (node != ancestor)) {
        if ((node->type == XML_ENTITY_REF_NODE) ||
            (node->type == XML_ENTITY_DECL))
            return (-1);
        if (node->type == XML_ELEMENT_NODE) {
            tst = node->nsDef;
            while (tst != NULL) {
                if ((tst->prefix == NULL)
                    && (prefix == NULL))
                    return (0);
                if ((tst->prefix != NULL)
                    && (prefix != NULL)
                    && (xmlStrEqual(tst->prefix, prefix)))
                    return (0);
                tst = tst->next;
            }
        }
        node = node->parent;
    }
    if (node != ancestor)
        return (-1);
    return (1);
}